

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::LowerFunctionBodyCallCountChange(Lowerer *this,Instr *insertBeforeInstr)

{
  Func *this_00;
  code *pcVar1;
  undefined8 uVar2;
  bool bVar3;
  bool bVar4;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar5;
  StackSym *sym;
  JITTimeWorkItem *this_01;
  Var address;
  AddrOpnd *src;
  IntConstOpnd *src2;
  RegOpnd *opndArg;
  Instr *pIVar6;
  HelperCallOpnd *newSrc;
  Instr *callInstr;
  Instr *onOverflowInsertBeforeInstr;
  undefined1 local_78 [8];
  AutoReuseOpnd autoReuseCountOpnd;
  IndirOpnd *countOpnd;
  undefined1 local_48 [8];
  AutoReuseOpnd autoReuseCountAddressOpnd;
  RegOpnd *countAddressOpnd;
  bool isSimpleJit;
  Func *func;
  Instr *insertBeforeInstr_local;
  Lowerer *this_local;
  
  if (insertBeforeInstr == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x684c,"(insertBeforeInstr)","insertBeforeInstr");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  this_00 = insertBeforeInstr->m_func;
  bVar3 = Func::IsSimpleJit(this_00);
  if (bVar3) {
    sourceContextId = Func::GetSourceContextId(this->m_func);
    functionId = Func::GetLocalFunctionId(this->m_func);
    bVar4 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,FullJitPhase,sourceContextId,functionId);
    if (bVar4) {
      return;
    }
  }
  sym = StackSym::New(TyUint64,this_00);
  autoReuseCountAddressOpnd._16_8_ = IR::RegOpnd::New(sym,TyUint64,this_00);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_48,(Opnd *)autoReuseCountAddressOpnd._16_8_,this_00,true);
  uVar2 = autoReuseCountAddressOpnd._16_8_;
  this_01 = Func::GetWorkItem(this_00);
  address = (Var)JITTimeWorkItem::GetCallsCountAddress(this_01);
  src = IR::AddrOpnd::New(address,AddrOpndKindDynamicMisc,this_00,true,(Var)0x0);
  InsertMove((Opnd *)uVar2,&src->super_Opnd,insertBeforeInstr,true);
  autoReuseCountOpnd._16_8_ =
       IR::IndirOpnd::New((RegOpnd *)autoReuseCountAddressOpnd._16_8_,0,TyUint32,this_00,false);
  IR::AutoReuseOpnd::AutoReuseOpnd
            ((AutoReuseOpnd *)local_78,(Opnd *)autoReuseCountOpnd._16_8_,this_00,true);
  uVar2 = autoReuseCountOpnd._16_8_;
  if (bVar3) {
    InsertDecUInt32PreventOverflow
              ((Opnd *)autoReuseCountOpnd._16_8_,(Opnd *)autoReuseCountOpnd._16_8_,insertBeforeInstr
               ,&callInstr);
    pIVar6 = callInstr;
    opndArg = IR::Opnd::CreateFramePointerOpnd(this_00);
    LowererMD::LoadHelperArgument(&this->m_lowererMD,pIVar6,&opndArg->super_Opnd);
    pIVar6 = IR::Instr::New(Call,this_00);
    newSrc = IR::HelperCallOpnd::New(HelperTransitionFromSimpleJit,this_00);
    IR::Instr::SetSrc1(pIVar6,&newSrc->super_Opnd);
    IR::Instr::InsertBefore(callInstr,pIVar6);
    LowererMD::LowerCall(&this->m_lowererMD,pIVar6,0);
  }
  else {
    src2 = IR::IntConstOpnd::New(1,TyUint32,this_00,false);
    InsertAdd(false,(Opnd *)uVar2,(Opnd *)uVar2,&src2->super_Opnd,insertBeforeInstr);
  }
  onOverflowInsertBeforeInstr._4_4_ = (uint)!bVar3;
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_78);
  IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)local_48);
  return;
}

Assistant:

void Lowerer::LowerFunctionBodyCallCountChange(IR::Instr *const insertBeforeInstr)
{
    Assert(insertBeforeInstr);

    Func *const func = insertBeforeInstr->m_func;
    const bool isSimpleJit = func->IsSimpleJit();

    if ((isSimpleJit && PHASE_OFF(Js::FullJitPhase, m_func)))
    {
        return;
    }

    // mov countAddress, <countAddress>
    IR::RegOpnd *const countAddressOpnd = IR::RegOpnd::New(StackSym::New(TyMachPtr, func), TyMachPtr, func);
    const IR::AutoReuseOpnd autoReuseCountAddressOpnd(countAddressOpnd, func);
    InsertMove(
        countAddressOpnd,
        IR::AddrOpnd::New((Js::Var)func->GetWorkItem()->GetCallsCountAddress(), IR::AddrOpndKindDynamicMisc, func, true),
        insertBeforeInstr);

    IR::IndirOpnd *const countOpnd = IR::IndirOpnd::New(countAddressOpnd, 0, TyUint32, func);
    const IR::AutoReuseOpnd autoReuseCountOpnd(countOpnd, func);
    if(!isSimpleJit)
    {
        InsertAdd(false, countOpnd, countOpnd, IR::IntConstOpnd::New(1, TyUint32, func), insertBeforeInstr);
        return;
    }

    IR::Instr *onOverflowInsertBeforeInstr;
    InsertDecUInt32PreventOverflow(
        countOpnd,
        countOpnd,
        insertBeforeInstr,
        &onOverflowInsertBeforeInstr);

    //   ($overflow:)
    //     TransitionFromSimpleJit(framePointer)
    m_lowererMD.LoadHelperArgument(onOverflowInsertBeforeInstr, IR::Opnd::CreateFramePointerOpnd(func));
    IR::Instr *const callInstr = IR::Instr::New(Js::OpCode::Call, func);
    callInstr->SetSrc1(IR::HelperCallOpnd::New(IR::HelperTransitionFromSimpleJit, func));
    onOverflowInsertBeforeInstr->InsertBefore(callInstr);
    m_lowererMD.LowerCall(callInstr, 0);
}